

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *target_00;
  cmOSXBundleGenerator *this_00;
  string local_48;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileUtilityTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_00969368;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnUtility;
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  target_00 = local_18;
  std::__cxx11::string::string
            ((string *)&local_48,
             (string *)
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target_00,&local_48);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  std::__cxx11::string::~string((string *)&local_48);
  cmOSXBundleGenerator::SetMacContentFolders
            ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator,
             &(this->super_cmMakefileTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnUtility;
  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}